

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O2

uint32_t __thiscall GGWave::encodeSize_samples(GGWave *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if ((this->m_tx).hasData != false) {
    iVar2 = this->m_samplesPerFrame;
    if (this->m_needResampling == true) {
      iVar2 = Resampler::resample(&this->m_resampler,this->m_sampleRate / this->m_sampleRateOut,
                                  iVar2,(this->m_tx).output.m_data,(float *)0x0);
      iVar2 = iVar2 + 1;
    }
    uVar1 = (this->m_tx).dataLength;
    if ((int)uVar1 < 4) {
      iVar3 = 2;
    }
    else if (uVar1 < 0xf) {
      iVar3 = 4;
    }
    else {
      iVar3 = (uVar1 / 5) * 2;
    }
    iVar4 = (int)(this->m_tx).protocol.bytesPerTx;
    return ((int)(this->m_tx).protocol.framesPerTx * (int)(this->m_tx).protocol.extra *
            ((int)(iVar4 + uVar1 + iVar3 + this->m_encodedDataOffset + -1) / iVar4) +
           this->m_nMarkerFrames * 2) * iVar2;
  }
  return 0;
}

Assistant:

uint32_t GGWave::encodeSize_samples() const {
    if (m_tx.hasData == false) {
        return 0;
    }

    float factor = 1.0f;
    int samplesPerFrameOut = m_samplesPerFrame;
    if (m_needResampling) {
        factor = m_sampleRate/m_sampleRateOut;
        // note : +1 extra sample in order to overestimate the buffer size
        samplesPerFrameOut = m_resampler.resample(factor, m_samplesPerFrame, m_tx.output.data(), nullptr) + 1;
    }
    const int nECCBytesPerTx = getECCBytesForLength(m_tx.dataLength);
    const int sendDataLength = m_tx.dataLength + m_encodedDataOffset;
    const int totalBytes = sendDataLength + nECCBytesPerTx;
    const int totalDataFrames = m_tx.protocol.extra*((totalBytes + m_tx.protocol.bytesPerTx - 1)/m_tx.protocol.bytesPerTx)*m_tx.protocol.framesPerTx;

    return (
            m_nMarkerFrames + totalDataFrames + m_nMarkerFrames
           )*samplesPerFrameOut;
}